

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void mpt_copy_df(int pts,double *src,int lds,float *dest,int ldd)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  float fVar4;
  int iVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar8;
  
  auVar1 = _DAT_0011f070;
  if (0 < pts) {
    if (ldd == 0) {
      *dest = (float)src[(pts + -1) * lds];
      return;
    }
    if (lds == 0) {
      fVar4 = (float)*src;
      lVar2 = (ulong)(uint)pts - 1;
      auVar5._8_4_ = (int)lVar2;
      auVar5._0_8_ = lVar2;
      auVar5._12_4_ = (int)((ulong)lVar2 >> 0x20);
      lVar2 = 0;
      auVar5 = auVar5 ^ _DAT_0011f070;
      auVar7 = _DAT_0011f050;
      auVar9 = _DAT_0011f060;
      do {
        auVar10 = auVar9 ^ auVar1;
        iVar6 = auVar5._4_4_;
        if ((bool)(~(auVar10._4_4_ == iVar6 && auVar5._0_4_ < auVar10._0_4_ || iVar6 < auVar10._4_4_
                    ) & 1)) {
          *(float *)((long)dest + lVar2) = fVar4;
        }
        if ((auVar10._12_4_ != auVar5._12_4_ || auVar10._8_4_ <= auVar5._8_4_) &&
            auVar10._12_4_ <= auVar5._12_4_) {
          *(float *)((long)dest + lVar2 + 4) = fVar4;
        }
        auVar10 = auVar7 ^ auVar1;
        iVar11 = auVar10._4_4_;
        if (iVar11 <= iVar6 && (iVar11 != iVar6 || auVar10._0_4_ <= auVar5._0_4_)) {
          *(float *)((long)dest + lVar2 + 8) = fVar4;
          *(float *)((long)dest + lVar2 + 0xc) = fVar4;
        }
        lVar8 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 4;
        auVar9._8_8_ = lVar8 + 4;
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 4;
        auVar7._8_8_ = lVar8 + 4;
        lVar2 = lVar2 + 0x10;
      } while ((ulong)(pts + 3U >> 2) << 4 != lVar2);
    }
    else if (ldd == 1 && lds == 1) {
      uVar3 = 0;
      do {
        dest[uVar3] = (float)src[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)pts != uVar3);
    }
    else {
      do {
        *dest = (float)*src;
        dest = dest + ldd;
        src = src + lds;
        pts = pts + -1;
      } while (pts != 0);
    }
  }
  return;
}

Assistant:

extern void MPT_COPY_FCN(int pts, const MPT_COPY_ST *src, int lds, MPT_COPY_DT *dest, int ldd)
{
	int i, j;
	
	if (pts <= 0) {
		return;
	}
	if (!ldd) {
		dest[0] = src[(pts - 1) * lds];
		return;
	}
	if (!lds) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[0];
		}
		return;
	}
	if (lds == 1 && ldd == 1) {
		for (i = 0; i < pts; i++) {
			dest[i] = src[i];
		}
		return;
	}
	for (i = 0, j = 0; pts--; i += ldd, j += lds) {
		dest[i] = src[j];
	}
}